

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O1

char * getrule(char *strp,rule *rulep)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  
  bVar1 = *strp;
  if (bVar1 == 0x4d) {
    rulep->type = MONTH_NTH_DAY_OF_WEEK;
    bVar1 = strp[1];
    if (bVar1 - 0x30 < 10) {
      pcVar2 = strp + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (0xc < iVar3) goto LAB_0010760a;
        bVar1 = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      } while (bVar1 - 0x30 < 10);
      if (iVar3 < 1) goto LAB_0010760a;
      rulep->mon = iVar3;
    }
    else {
LAB_0010760a:
      pcVar2 = (char *)0x0;
    }
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    bVar1 = pcVar2[1];
    if (bVar1 - 0x30 < 10) {
      pcVar2 = pcVar2 + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (5 < iVar3) goto LAB_0010765a;
        bVar1 = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      } while (bVar1 - 0x30 < 10);
      if (iVar3 < 1) goto LAB_0010765a;
      rulep->week = iVar3;
    }
    else {
LAB_0010765a:
      pcVar2 = (char *)0x0;
    }
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    bVar1 = pcVar2[1];
    if (bVar1 - 0x30 < 10) {
      strp = pcVar2 + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (6 < iVar3) goto LAB_0010769e;
        bVar1 = strp[1];
        strp = strp + 1;
      } while (bVar1 - 0x30 < 10);
      goto LAB_001075fa;
    }
LAB_0010769e:
    strp = (char *)0x0;
  }
  else {
    if (bVar1 == 0x4a) {
      rulep->type = JULIAN_DAY;
      bVar1 = strp[1];
      if (9 < bVar1 - 0x30) goto LAB_0010769e;
      strp = strp + 1;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (0x16d < iVar3) goto LAB_0010769e;
        bVar1 = strp[1];
        strp = strp + 1;
      } while (bVar1 - 0x30 < 10);
      if (iVar3 < 1) goto LAB_0010769e;
    }
    else {
      if (9 < bVar1 - 0x30) {
        return (char *)0x0;
      }
      rulep->type = DAY_OF_YEAR;
      bVar1 = *strp;
      if (9 < bVar1 - 0x30) goto LAB_0010769e;
      iVar3 = 0;
      do {
        iVar3 = (int)(char)bVar1 + iVar3 * 10 + -0x30;
        if (0x16d < iVar3) goto LAB_0010769e;
        bVar1 = strp[1];
        strp = strp + 1;
      } while (bVar1 - 0x30 < 10);
LAB_001075fa:
      if (iVar3 < 0) goto LAB_0010769e;
    }
    rulep->day = iVar3;
  }
  if (strp == (char *)0x0) {
    return (char *)0x0;
  }
  if (*strp == '/') {
    pcVar2 = getoffset(strp + 1,&rulep->time);
    return pcVar2;
  }
  rulep->time = 0x1c20;
  return strp;
}

Assistant:

static const char * getrule( const char * strp, struct rule * rulep )
{
    if ( *strp == 'J' )
    {
        /* Julian day. */
        rulep->type = JULIAN_DAY;
        ++strp;
        strp = getnum( strp, &rulep->day, 1, DAYSPERNYEAR );
    }
    else if ( *strp == 'M' )
    {
        /* Month, week, day. */
        rulep->type = MONTH_NTH_DAY_OF_WEEK;
        ++strp;
        strp = getnum( strp, &rulep->mon, 1, MONSPERYEAR );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->week, 1, 5 );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->day, 0, DAYSPERWEEK - 1 );
    }
    else if ( isdigit( (unsigned char)*strp ) )
    {
        /* Day of year. */
        rulep->type = DAY_OF_YEAR;
        strp = getnum( strp, &rulep->day, 0, DAYSPERLYEAR - 1 );
    }
    else
    {
        return NULL;        /* invalid format */
    }

    if ( strp == NULL )
    {
        return NULL;
    }

    if ( *strp == '/' )
    {
        /* Time specified. */
        ++strp;
        strp = getoffset( strp, &rulep->time );
    }
    else
    {
        rulep->time = 2 * SECSPERHOUR;    /* default = 2:00:00 */
    }

    return strp;
}